

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O0

int nn_node_unsubscribe(nn_trie_node **self,uint8_t *data,size_t size)

{
  nn_trie_node *pnVar1;
  uint uVar2;
  int iVar3;
  uint8_t *puVar4;
  long lVar5;
  nn_trie_node **ppnVar6;
  nn_trie_node **ppnVar7;
  nn_trie_node *pnVar8;
  bool bVar9;
  nn_trie_node *ch2;
  nn_trie_node *new_node;
  nn_trie_node **ch;
  int new_min;
  int index;
  int j;
  int i;
  size_t size_local;
  uint8_t *data_local;
  nn_trie_node **self_local;
  
  if (size != 0) {
    uVar2 = nn_node_check_prefix(*self,data,size);
    if (uVar2 != (*self)->prefix_len) {
      return 0;
    }
    puVar4 = data + (int)(uint)(*self)->prefix_len;
    lVar5 = size - (*self)->prefix_len;
    if (lVar5 != 0) {
      ppnVar6 = nn_node_next(*self,*puVar4);
      if (ppnVar6 == (nn_trie_node **)0x0) {
        return 0;
      }
      iVar3 = nn_node_unsubscribe(ppnVar6,puVar4 + 1,lVar5 - 1);
      if (iVar3 == 0) {
        return 0;
      }
      if (*ppnVar6 != (nn_trie_node *)0x0) {
        return 1;
      }
      if ((*self)->type < 9) {
        ch._4_4_ = 0;
        while ((ch._4_4_ != (*self)->type && ((*self)->prefix[(long)(int)ch._4_4_ + 10] != *puVar4))
              ) {
          ch._4_4_ = ch._4_4_ + 1;
        }
        if (ch._4_4_ == (*self)->type) {
          __assert_fail("index != (*self)->type",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                        ,0x210,
                        "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
        }
        memmove((*self)->prefix + (long)(int)ch._4_4_ + 10,
                (*self)->prefix + (long)(int)ch._4_4_ + 0xb,
                (long)(int)(((*self)->type - ch._4_4_) + -1));
        ppnVar6 = nn_node_child(*self,ch._4_4_);
        ppnVar7 = nn_node_child(*self,ch._4_4_ + 1);
        memmove(ppnVar6,ppnVar7,(long)(int)(((*self)->type - ch._4_4_) + -1) << 3);
        (*self)->type = (*self)->type + 0xff;
        pnVar8 = (nn_trie_node *)nn_realloc(*self,(ulong)(*self)->type * 8 + 0x18);
        *self = pnVar8;
        if (*self == (nn_trie_node *)0x0) {
          __assert_fail("*self",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                        ,0x21e,
                        "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
        }
        if (((*self)->type == '\0') && (iVar3 = nn_node_has_subscribers(*self), iVar3 == 0)) {
          nn_free(*self);
          *self = (nn_trie_node *)0x0;
          return 1;
        }
        pnVar8 = nn_node_compact(*self);
        *self = pnVar8;
        return 1;
      }
      if (((*self)->u).dense.nbr < 10) {
        pnVar8 = (nn_trie_node *)nn_alloc_(0x58);
        if (pnVar8 == (nn_trie_node *)0x0) {
          __assert_fail("new_node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                        ,0x260,
                        "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
        }
        pnVar8->refcount = 0;
        pnVar8->prefix_len = (*self)->prefix_len;
        memcpy(pnVar8->prefix,(*self)->prefix,(ulong)pnVar8->prefix_len);
        pnVar8->type = '\b';
        new_min = 0;
        for (index = 0;
            index != ((uint)((*self)->u).sparse.children[1] - (uint)((*self)->u).sparse.children[0])
                     + 1; index = index + 1) {
          ppnVar6 = nn_node_child(*self,index);
          pnVar1 = *ppnVar6;
          if (pnVar1 != (nn_trie_node *)0x0) {
            pnVar8->prefix[(long)new_min + 10] = (char)index + ((*self)->u).sparse.children[0];
            ppnVar6 = nn_node_child(pnVar8,new_min);
            *ppnVar6 = pnVar1;
            new_min = new_min + 1;
          }
        }
        if (new_min == 8) {
          nn_free(*self);
          *self = pnVar8;
          return 1;
        }
        __assert_fail("j == NN_TRIE_SPARSE_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                      ,0x26f,
                      "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
      }
      if (*puVar4 == ((*self)->u).sparse.children[0]) {
        index = 0;
        while ((index != ((uint)((*self)->u).sparse.children[1] -
                         (uint)((*self)->u).sparse.children[0]) + 1 &&
               (ppnVar6 = nn_node_child(*self,index), *ppnVar6 == (nn_trie_node *)0x0))) {
          index = index + 1;
        }
        iVar3 = index + (uint)((*self)->u).sparse.children[0];
        ppnVar6 = nn_node_child(*self,0);
        ppnVar7 = nn_node_child(*self,index);
        memmove(ppnVar6,ppnVar7,
                (long)(int)(((uint)((*self)->u).sparse.children[1] - iVar3) + 1) << 3);
        ((*self)->u).sparse.children[0] = (uint8_t)iVar3;
        ((*self)->u).dense.nbr = ((*self)->u).dense.nbr - 1;
        pnVar8 = (nn_trie_node *)
                 nn_realloc(*self,(long)(int)(((uint)((*self)->u).sparse.children[1] - iVar3) + 1) *
                                  8 + 0x18);
        *self = pnVar8;
        if (*self != (nn_trie_node *)0x0) {
          return 1;
        }
        __assert_fail("*self",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                      ,0x244,
                      "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
      }
      if (*puVar4 != ((*self)->u).sparse.children[1]) {
        ((*self)->u).dense.nbr = ((*self)->u).dense.nbr - 1;
        return 1;
      }
      index = (uint)((*self)->u).sparse.children[1] - (uint)((*self)->u).sparse.children[0];
      while ((index != 0 && (ppnVar6 = nn_node_child(*self,index), *ppnVar6 == (nn_trie_node *)0x0))
            ) {
        index = index + -1;
      }
      ((*self)->u).sparse.children[1] = (char)index + ((*self)->u).sparse.children[0];
      ((*self)->u).dense.nbr = ((*self)->u).dense.nbr - 1;
      pnVar8 = (nn_trie_node *)
               nn_realloc(*self,(long)(int)(((uint)((*self)->u).sparse.children[1] -
                                            (uint)((*self)->u).sparse.children[0]) + 1) * 8 + 0x18);
      *self = pnVar8;
      if (*self != (nn_trie_node *)0x0) {
        return 1;
      }
      __assert_fail("*self",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/trie.c"
                    ,0x253,
                    "int nn_node_unsubscribe(struct nn_trie_node **, const uint8_t *, size_t)");
    }
  }
  bVar9 = true;
  if (*self != (nn_trie_node *)0x0) {
    iVar3 = nn_node_has_subscribers(*self);
    bVar9 = iVar3 == 0;
  }
  if (bVar9) {
    self_local._4_4_ = -0x16;
  }
  else {
    (*self)->refcount = (*self)->refcount - 1;
    if ((*self)->refcount == 0) {
      if ((*self)->type == '\0') {
        nn_free(*self);
        *self = (nn_trie_node *)0x0;
        self_local._4_4_ = 1;
      }
      else {
        pnVar8 = nn_node_compact(*self);
        *self = pnVar8;
        self_local._4_4_ = 1;
      }
    }
    else {
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

static int nn_node_unsubscribe (struct nn_trie_node **self,
    const uint8_t *data, size_t size)
{
    int i;
    int j;
    int index;
    int new_min;
    struct nn_trie_node **ch;
    struct nn_trie_node *new_node;
    struct nn_trie_node *ch2;

    if (!size)
        goto found;

    /*  If prefix does not match the data, return. */
    if (nn_node_check_prefix (*self, data, size) != (*self)->prefix_len)
        return 0;

    /*  Skip the prefix. */
    data += (*self)->prefix_len;
    size -= (*self)->prefix_len;

    if (!size)
        goto found;

    /*  Move to the next node. */
    ch = nn_node_next (*self, *data);
    if (!ch)
        return 0; /*  TODO: This should be an error. */

    /*  Recursive traversal of the trie happens here. If the subscription
        wasn't really removed, nothing have changed in the trie and
        no additional pruning is needed. */
    if (nn_node_unsubscribe (ch, data + 1, size - 1) == 0)
        return 0;

    /*  Subscription removal is already done. Now we are going to compact
        the trie. However, if the following node remains in place, there's
        nothing to compact here. */
    if (*ch)
        return 1;

    /*  Sparse array. */
    if ((*self)->type < NN_TRIE_DENSE_TYPE) {

        /*  Get the indices of the removed child. */
        for (index = 0; index != (*self)->type; ++index)
            if ((*self)->u.sparse.children [index] == *data)
                break;
        assert (index != (*self)->type);

        /*  Remove the destroyed child from both lists of children. */
        memmove (
            (*self)->u.sparse.children + index,
            (*self)->u.sparse.children + index + 1,
            (*self)->type - index - 1);
        memmove (
            nn_node_child (*self, index),
            nn_node_child (*self, index + 1),
            ((*self)->type - index - 1) * sizeof (struct nn_trie_node*));
        --(*self)->type;
        *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
            ((*self)->type * sizeof (struct nn_trie_node*)));
        assert (*self);
        
        /*  If there are no more children and no refcount, we can delete
            the node altogether. */
        if (!(*self)->type && !nn_node_has_subscribers (*self)) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);

        return 1;
    }

    /*  Dense array. */

    /*  In this case the array stays dense. We have to adjust the limits of
        the array, if appropriate. */
    if ((*self)->u.dense.nbr > NN_TRIE_SPARSE_MAX + 1) {

        /*  If the removed item is the leftmost one, trim the array from
            the left side. */
        if (*data == (*self)->u.dense.min) {
             for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
                   ++i)
                 if (*nn_node_child (*self, i))
                     break;
             new_min = i + (*self)->u.dense.min;
             memmove (nn_node_child (*self, 0), nn_node_child (*self, i),
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             (*self)->u.dense.min = new_min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the removed item is the rightmost one, trim the array from
            the right side. */
        if (*data == (*self)->u.dense.max) {
             for (i = (*self)->u.dense.max - (*self)->u.dense.min; i != 0; --i)
                 if (*nn_node_child (*self, i))
                     break;
             (*self)->u.dense.max = i + (*self)->u.dense.min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - (*self)->u.dense.min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the item is removed from the middle of the array, do nothing. */
        --(*self)->u.dense.nbr;
        return 1;
    }

    /*  Convert dense array into sparse array. */
    {
        new_node = nn_alloc (sizeof (struct nn_trie_node) +
            NN_TRIE_SPARSE_MAX * sizeof (struct nn_trie_node*), "trie node");
        assert (new_node);
        new_node->refcount = 0;
        new_node->prefix_len = (*self)->prefix_len;
        memcpy (new_node->prefix, (*self)->prefix, new_node->prefix_len);
        new_node->type = NN_TRIE_SPARSE_MAX;
        j = 0;
        for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
              ++i) {
            ch2 = *nn_node_child (*self, i);
            if (ch2) {
                new_node->u.sparse.children [j] = i + (*self)->u.dense.min;
                *nn_node_child (new_node, j) = ch2;
                ++j;
            }
        }
        assert (j == NN_TRIE_SPARSE_MAX);
        nn_free (*self);
        *self = new_node;
        return 1;
    }

found:

    /*  We are at the end of the subscription here. */

    /*  Subscription doesn't exist. */
    if (nn_slow (!*self || !nn_node_has_subscribers (*self)))
        return -EINVAL;

    /*  Subscription exists. Unsubscribe. */
    --(*self)->refcount;

    /*  If reference count has dropped to zero we can try to compact
        the node. */
    if (!(*self)->refcount) {

        /*  If there are no children, we can delete the node altogether. */
        if (!(*self)->type) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);
        return 1;
    }

    return 0;
}